

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iothub_registrymanager.c
# Opt level: O0

char * getStatusStringForJson(IOTHUB_DEVICE_STATUS status)

{
  undefined8 local_18;
  char *statusForJson;
  IOTHUB_DEVICE_STATUS status_local;
  
  if (status == IOTHUB_DEVICE_STATUS_DISABLED) {
    local_18 = DEVICE_JSON_DEFAULT_VALUE_DISABLED;
  }
  else {
    local_18 = DEVICE_JSON_DEFAULT_VALUE_ENABLED;
  }
  return local_18;
}

Assistant:

static const char *getStatusStringForJson(IOTHUB_DEVICE_STATUS status)
{
    const char *statusForJson;

    if (IOTHUB_DEVICE_STATUS_DISABLED == status)
    {
        statusForJson = DEVICE_JSON_DEFAULT_VALUE_DISABLED;
    }
    else
    {
        statusForJson = DEVICE_JSON_DEFAULT_VALUE_ENABLED;
    }

    return statusForJson;
}